

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O2

void __thiscall
SoapySDR::Device::writeSetting<char_const*>
          (Device *this,int direction,size_t channel,string *key,char **value)

{
  string sStack_48;
  
  SettingToString<char_const*>(&sStack_48,(SoapySDR *)value,(char **)channel);
  (*this->_vptr_Device[0x6a])(this,direction,channel,key,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const int direction, const size_t channel, const std::string &key, const Type &value)
{
    this->writeSetting(direction, channel, key, SoapySDR::SettingToString(value));
}